

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStructBody
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *pFVar2;
  StructDef *struct_def_00;
  pointer pcVar3;
  Type type;
  mapped_type *pmVar4;
  long *plVar5;
  size_type *psVar6;
  Type *type_00;
  _Alloc_hider _Var7;
  pointer ppFVar8;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  key_type local_120;
  _Alloc_hider in_stack_ffffffffffffff00;
  size_type sVar9;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 uVar10;
  undefined8 in_stack_ffffffffffffff18;
  string local_d0;
  string local_b0;
  IdlNamer *local_90;
  long *local_88 [2];
  long local_78 [2];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_68;
  string local_50;
  
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"align","");
  NumToString<unsigned_long>((string *)&stack0xffffffffffffff00,struct_def->minalign);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,&local_120);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
    operator_delete(in_stack_ffffffffffffff00._M_p,in_stack_ffffffffffffff10 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"size","");
  NumToString<unsigned_long>((string *)&stack0xffffffffffffff00,struct_def->bytesize);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,&local_120);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
    operator_delete(in_stack_ffffffffffffff00._M_p,in_stack_ffffffffffffff10 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"builder.prep({{align}}, {{size}})","");
  CodeWriter::operator+=(writer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_68,&(struct_def->fields).vec);
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90 = &this->namer_;
    ppFVar8 = local_68.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    do {
      pFVar2 = ppFVar8[-1];
      if (pFVar2->padding != 0) {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"pad","");
        NumToString<unsigned_long>((string *)&stack0xffffffffffffff00,pFVar2->padding);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
          operator_delete(in_stack_ffffffffffffff00._M_p,in_stack_ffffffffffffff10 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"builder.pad({{pad}})","");
        CodeWriter::operator+=(writer,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      if (((pFVar2->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((pFVar2->value).type.struct_def)->fixed == true)) {
        struct_def_00 = (pFVar2->value).type.struct_def;
        _Var7._M_p = &stack0xffffffffffffff10;
        pcVar3 = (pFVar2->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffff00,pcVar3,
                   pcVar3 + (pFVar2->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&stack0xffffffffffffff00);
        strlen(nameprefix);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&stack0xffffffffffffff00,0,(char *)0x0,(ulong)nameprefix)
        ;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_120.field_2._M_allocated_capacity = *psVar6;
          local_120.field_2._8_8_ = plVar5[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar6;
          local_120._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_120._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        GenStructBody(this,struct_def_00,writer,local_120._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        in_stack_ffffffffffffff00._M_p = _Var7._M_p;
        uVar10 = in_stack_ffffffffffffff10;
        if (_Var7._M_p != &stack0xffffffffffffff10) {
LAB_001ef5cb:
          operator_delete(_Var7._M_p,in_stack_ffffffffffffff10 + 1);
        }
      }
      else {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"type","");
        GenMethod_abi_cxx11_
                  ((string *)&stack0xffffffffffffff00,(KotlinGenerator *)&pFVar2->value,type_00);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
          operator_delete(in_stack_ffffffffffffff00._M_p,in_stack_ffffffffffffff10 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"argname","");
        (*(local_90->super_Namer)._vptr_Namer[7])(local_88,local_90,pFVar2);
        strlen(nameprefix);
        paVar1 = &local_120.field_2;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_88,0,(char *)0x0,(ulong)nameprefix);
        in_stack_ffffffffffffff00._M_p = &stack0xffffffffffffff10;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          uVar10 = *psVar6;
          in_stack_ffffffffffffff18 = plVar5[3];
        }
        else {
          uVar10 = *psVar6;
          in_stack_ffffffffffffff00._M_p = (pointer)*plVar5;
        }
        sVar9 = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
          operator_delete(in_stack_ffffffffffffff00._M_p,uVar10 + 1);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        local_120._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"cast","");
        type.struct_def = (StructDef *)sVar9;
        type._0_8_ = in_stack_ffffffffffffff00._M_p;
        type.enum_def = (EnumDef *)uVar10;
        type._24_8_ = in_stack_ffffffffffffff18;
        CastToSigned_abi_cxx11_(type);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if (in_stack_ffffffffffffff00._M_p != &stack0xffffffffffffff10) {
          operator_delete(in_stack_ffffffffffffff00._M_p,uVar10 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"builder.put{{type}}({{argname}}{{cast}})","");
        CodeWriter::operator+=(writer,&local_d0);
        in_stack_ffffffffffffff10 = local_d0.field_2._M_allocated_capacity;
        _Var7._M_p = local_d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_001ef5cb;
      }
      ppFVar8 = ppFVar8 + -1;
      in_stack_ffffffffffffff10 = uVar10;
    } while (ppFVar8 !=
             local_68.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname", nameprefix + namer_.Variable(field));
        writer.SetValue("cast", CastToSigned(field.value.type));
        writer += "builder.put{{type}}({{argname}}{{cast}})";
      }
    }
  }